

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void Luv24toXYZ(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint32_t *puVar1;
  
  puVar1 = (uint32_t *)sp->tbuf;
  for (; 0 < n; n = n + -1) {
    LogLuv24toXYZ(*puVar1,(float *)op);
    op = (uint8_t *)((long)op + 0xc);
    puVar1 = puVar1 + 1;
  }
  return;
}

Assistant:

static void Luv24toXYZ(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    float *xyz = (float *)op;

    while (n-- > 0)
    {
        LogLuv24toXYZ(*luv, xyz);
        xyz += 3;
        luv++;
    }
}